

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping.c
# Opt level: O1

int mpt_mapping_del(mpt_array *arr,mpt_valsrc *src,mpt_laydest *dst,int cli)

{
  char *pcVar1;
  _mpt_vptr_buffer **pp_Var2;
  byte *pbVar3;
  mpt_buffer *pmVar4;
  ulong uVar5;
  _mpt_vptr_buffer **pp_Var6;
  long lVar7;
  size_t sVar8;
  _mpt_vptr_buffer **pp_Var9;
  ulong uVar10;
  
  pmVar4 = arr->_buf;
  if (pmVar4 == (mpt_buffer *)0x0) {
    return 0;
  }
  uVar5 = pmVar4->_used;
  lVar7 = 0;
  if (7 < uVar5) {
    uVar10 = 0;
    do {
      if (((uint)*(ushort *)((long)&pmVar4[1]._vptr + uVar10 * 8 + 2) == cli) &&
         ((dst == (mpt_laydest *)0x0 ||
          ((((*(uint8_t *)((long)&pmVar4[1]._vptr + uVar10 * 8 + 4) == dst->lay &&
             (*(uint8_t *)((long)&pmVar4[1]._vptr + uVar10 * 8 + 5) == dst->grf)) &&
            (*(uint8_t *)((long)&pmVar4[1]._vptr + uVar10 * 8 + 6) == dst->wld)) &&
           (*(uint8_t *)((long)&pmVar4[1]._vptr + uVar10 * 8 + 7) == dst->dim)))))) {
        if (src == (mpt_valsrc *)0x0) {
          *(undefined1 *)((long)&pmVar4[1]._vptr + uVar10 * 8 + 1) = 0;
        }
        else {
          if (*(uint8_t *)(&pmVar4[1]._vptr + uVar10) != src->dim) goto LAB_001048aa;
          pbVar3 = (byte *)((long)&pmVar4[1]._vptr + uVar10 * 8 + 1);
          *pbVar3 = *pbVar3 & ~src->state;
        }
        lVar7 = lVar7 + 1;
      }
LAB_001048aa:
      uVar10 = uVar10 + 1;
    } while (uVar5 >> 3 != uVar10);
  }
  if (lVar7 != 0) {
    sVar8 = 0;
    if (7 < uVar5) {
      pp_Var9 = (_mpt_vptr_buffer **)0x0;
      uVar10 = 0;
      do {
        pp_Var2 = &pmVar4[1]._vptr + uVar10;
        if (*(char *)((long)pp_Var2 + 1) == '\0') {
          if (pp_Var9 == (_mpt_vptr_buffer **)0x0) {
            pp_Var9 = pp_Var2;
          }
        }
        else {
          sVar8 = sVar8 + 1;
          if (pp_Var9 == (_mpt_vptr_buffer **)0x0) {
            pp_Var9 = (_mpt_vptr_buffer **)0x0;
          }
          else {
            *pp_Var9 = *pp_Var2;
            *(undefined1 *)((long)pp_Var2 + 1) = 0;
            pp_Var6 = pp_Var9;
            do {
              pp_Var9 = pp_Var6 + 1;
              if (pp_Var2 <= pp_Var9) break;
              pcVar1 = (char *)((long)pp_Var6 + 9);
              pp_Var6 = pp_Var9;
            } while (*pcVar1 != '\0');
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar5 >> 3);
      sVar8 = sVar8 << 3;
    }
    pmVar4->_used = sVar8;
  }
  return (int)lVar7;
}

Assistant:

extern int mpt_mapping_del(const MPT_STRUCT(array) *arr, const MPT_STRUCT(valsrc) *src, const MPT_STRUCT(laydest) *dst, int cli)
{
	MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(mapping) *map;
	size_t i, len = 0, del = 0;
	
	if (!(buf = arr->_buf)) {
		return 0;
	}
	len = buf->_used / sizeof(*map);
	map = (void *) (buf + 1);
	
	/* binding matches existing */
	for (i = 0; i < len; ++i) {
		/* binding not mergeable */
		if (map[i].client != cli) {
			continue;
		}
		if (dst
		    && (map[i].dest.lay != dst->lay || map[i].dest.grf != dst->grf
		     || map[i].dest.wld != dst->wld || map[i].dest.dim != dst->dim)) {
			continue;
		}
		if (!src) {
			map[i].src.state = 0;
		}
		else if (map[i].src.dim != src->dim) {
			continue;
		}
		else {
			map[i].src.state &= ~src->state;
		}
		++del;
	}
	if (del) {
		MPT_STRUCT(mapping) *empty;
		size_t used;
		
		for (i = 0, used = 0, empty = 0; i < len; ++i) {
			if (!map[i].src.state) {
				if (!empty) {
					empty = map+i;
				}
				continue;
			}
			/* track number of active mappings */
			++used;
			
			/* no smaller position available */
			if (!empty) continue;
			
			/* move command entry */
			*empty = map[i];
			map[i].src.state = 0;
			
			/* find smallest free position */
			while (++empty < (map+i)) {
				if (!empty->src.state) {
					break;
				}
			}
		}
		buf->_used = used * sizeof(*map);
	}
	return del;
}